

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O2

void __thiscall wasm::ReorderFunctionsByName::run(ReorderFunctionsByName *this,Module *module)

{
  std::
  __sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderFunctionsByName::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&,std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>const&)_1_>>
            ((module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void run(Module* module) override {
    std::sort(module->functions.begin(),
              module->functions.end(),
              [](const std::unique_ptr<Function>& a,
                 const std::unique_ptr<Function>& b) -> bool {
                return a->name < b->name;
              });
  }